

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BitSelectSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::BitSelectSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  BitSelectSyntax *pBVar1;
  
  pBVar1 = (BitSelectSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BitSelectSyntax *)this->endPtr < pBVar1 + 1) {
    pBVar1 = (BitSelectSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pBVar1 + 1);
  }
  (pBVar1->super_SelectorSyntax).super_SyntaxNode.kind = BitSelect;
  (pBVar1->super_SelectorSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar1->super_SelectorSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pBVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pBVar1;
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }